

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_stream.h
# Opt level: O3

OutStream * __thiscall
r_comp::OutStream::push<char[3]>(OutStream *this,char (*t) [3],uint16_t code_index)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  unsigned_short *puVar4;
  size_t sVar5;
  undefined6 in_register_00000012;
  fpos<__mbstate_t> t_00;
  
  t_00 = (fpos<__mbstate_t>)std::ostream::tellp();
  r_code::vector<std::fpos<__mbstate_t>_>::push_back(&this->positions,t_00);
  iVar1 = *(int *)&(this->positions).m_vector.
                   super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this->positions).m_vector.
                   super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = r_code::vector<unsigned_short>::operator[]
                     (&this->code_indexes_to_stream_indexes,
                      CONCAT62(in_register_00000012,code_index) & 0xffffffff);
  *puVar4 = (short)((uint)(iVar1 - iVar2) >> 4) - 1;
  poVar3 = (ostream *)this->stream;
  sVar5 = strlen(*t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,*t,sVar5);
  return this;
}

Assistant:

OutStream &push(const T &t, uint16_t code_index)
    {
        positions.push_back(stream->tellp());
        code_indexes_to_stream_indexes[code_index] = positions.size() - 1;
        return *this << t;
    }